

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.cpp
# Opt level: O2

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::ProcessRRow::operator()
          (ProcessRRow *this,iterator_t *str,iterator_t end)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  DecPOMDPDiscrete *pDVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ParserDPOMDPFormat_Spirit *pPVar12;
  ostream *poVar13;
  E *pEVar14;
  pointer puVar15;
  pointer puVar16;
  pointer puVar17;
  uint uVar18;
  uint uVar19;
  vector<double,_std::allocator<double>_> row;
  stringstream ss;
  ostream local_1a8 [376];
  
  pPVar12 = this->_m_po;
  if (pPVar12->_m_lp_type != DOUBLE) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar13 = std::operator<<(local_1a8,"ProcessRRow:last parsed type should be a double. (at ");
    poVar13 = DPOMDPFormatParsing::operator<<(poVar13,&str->_pos);
    poVar13 = std::operator<<(poVar13,")");
    std::endl<char,std::char_traits<char>>(poVar13);
    pEVar14 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar14,&ss);
    __cxa_throw(pEVar14,&E::typeinfo,E::~E);
  }
  if ((long)(pPVar12->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(pPVar12->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start != 4) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar13 = std::operator<<(local_1a8,"ProcessRRow:_m_lp_fromSI has size != 1. (at ");
    poVar13 = DPOMDPFormatParsing::operator<<(poVar13,&str->_pos);
    poVar13 = std::operator<<(poVar13,")");
    std::endl<char,std::char_traits<char>>(poVar13);
    pEVar14 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar14,&ss);
    __cxa_throw(pEVar14,&E::typeinfo,E::~E);
  }
  bVar8 = IsRowMatrixLP(pPVar12);
  if (!bVar8) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar13 = std::operator<<(local_1a8,"ProcessRRow: a row matrix should have been parsed. (at ");
    poVar13 = DPOMDPFormatParsing::operator<<(poVar13,&str->_pos);
    poVar13 = std::operator<<(poVar13,")");
    std::endl<char,std::char_traits<char>>(poVar13);
    pEVar14 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar14,&ss);
    __cxa_throw(pEVar14,&E::typeinfo,E::~E);
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&row,(this->_m_po->_m_curMatrix).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  uVar9 = (**(code **)(*(long *)&(this->_m_po->_m_decPOMDPDiscrete->
                                 super_MultiAgentDecisionProcessDiscrete).
                                 super_MultiAgentDecisionProcess + 0x30))();
  uVar10 = (**(code **)(*(long *)&(this->_m_po->_m_decPOMDPDiscrete->
                                  super_MultiAgentDecisionProcessDiscrete).
                                  super_MultiAgentDecisionProcess + 0xd0))();
  if ((long)row.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)row.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start >> 3 == uVar10) {
    pPVar12 = this->_m_po;
    puVar3 = (pPVar12->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar18 = pPVar12->_m_anyStateIndex;
    if (*puVar3 == uVar18) {
      if ((pPVar12->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar3) {
        (pPVar12->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar3;
      }
      uVar18 = 0;
      while( true ) {
        _ss = uVar18;
        uVar11 = (**(code **)(*(long *)&(pPVar12->_m_decPOMDPDiscrete->
                                        super_MultiAgentDecisionProcessDiscrete).
                                        super_MultiAgentDecisionProcess + 0x30))();
        if (uVar11 <= uVar18) break;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->_m_po->_m_lp_fromSI,(value_type_conflict1 *)&ss);
        pPVar12 = this->_m_po;
        uVar18 = _ss + 1;
      }
      pPVar12 = this->_m_po;
      uVar18 = pPVar12->_m_anyStateIndex;
    }
    puVar15 = (pPVar12->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (*puVar15 == uVar18) {
      if ((pPVar12->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar15) {
        (pPVar12->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar15;
      }
      for (_ss = 0; _ss < uVar9; _ss = _ss + 1) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->_m_po->_m_lp_toSI,(value_type_conflict1 *)&ss);
      }
      pPVar12 = this->_m_po;
    }
    puVar4 = (pPVar12->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar15 = (pPVar12->_m_lp_fromSI).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start; puVar15 != puVar4; puVar15 = puVar15 + 1) {
      uVar18 = *puVar15;
      puVar5 = (this->_m_po->_m_lp_JAI).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar16 = (this->_m_po->_m_lp_JAI).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start; puVar16 != puVar5; puVar16 = puVar16 + 1) {
        uVar1 = *puVar16;
        puVar6 = (this->_m_po->_m_lp_toSI).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (puVar17 = (this->_m_po->_m_lp_toSI).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start; puVar17 != puVar6; puVar17 = puVar17 + 1) {
          uVar2 = *puVar17;
          for (uVar19 = 0; uVar9 = (ulong)uVar19, uVar9 < uVar10; uVar19 = uVar19 + 1) {
            pDVar7 = this->_m_po->_m_decPOMDPDiscrete;
            (**(code **)(*(long *)&(pDVar7->super_MultiAgentDecisionProcessDiscrete).
                                   super_MultiAgentDecisionProcess + 400))
                      (row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar9],pDVar7,uVar18,uVar1,uVar2,uVar9);
          }
        }
      }
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&row.super__Vector_base<double,_std::allocator<double>_>);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar13 = std::operator<<(local_1a8,"ProcessRRow: exected a row matrix with nrJO=");
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  poVar13 = std::operator<<(poVar13," entries. Found ");
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  poVar13 = std::operator<<(poVar13," entries. (at ");
  poVar13 = DPOMDPFormatParsing::operator<<(poVar13,&str->_pos);
  poVar13 = std::operator<<(poVar13,")");
  std::endl<char,std::char_traits<char>>(poVar13);
  pEVar14 = (E *)__cxa_allocate_exception(0x28);
  E::E(pEVar14,&ss);
  __cxa_throw(pEVar14,&E::typeinfo,E::~E);
}

Assistant:

void ParserDPOMDPFormat_Spirit::ProcessRRow::operator()(iterator_t str, iterator_t end) const
{
    if(_m_po->_m_lp_type != DOUBLE)
    {
        stringstream ss; ss<<"ProcessRRow:last parsed type should be a double. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }   
    //an actual matrix was parsed, check curMatrix size
    if( _m_po->_m_lp_toSI.size() != 1 )
    {
        stringstream ss; ss<<"ProcessRRow:_m_lp_fromSI has size != 1. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }
    if( !_m_po->IsRowMatrixLP() )
    {
        stringstream ss; ss<<"ProcessRRow: a row matrix should have been parsed. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }
    vector<double> row = _m_po->_m_curMatrix[0];
    size_t nrS = _m_po->GetDecPOMDPDiscrete()->GetNrStates();
    size_t nrJO = _m_po->GetDecPOMDPDiscrete()->GetNrJointObservations();
    if( row.size() != nrJO)
    {
        stringstream ss; ss<<"ProcessRRow: exected a row matrix with nrJO="<<nrJO<<" entries. Found "<<row.size()<< " entries. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }

    if( _m_po->_m_lp_fromSI[0] == _m_po->_m_anyStateIndex )
    {
        _m_po->_m_lp_fromSI.clear();
        for(Index si=0; si < _m_po->GetDecPOMDPDiscrete()->GetNrStates();si++)
            _m_po->_m_lp_fromSI.push_back(si);
    }
    if( _m_po->_m_lp_toSI[0] == _m_po->_m_anyStateIndex )
    {
        _m_po->_m_lp_toSI.clear();
        for(Index si=0; si < nrS; si++)
            _m_po->_m_lp_toSI.push_back(si);
    }    

    vector<Index>::iterator sI_it = _m_po->_m_lp_fromSI.begin();
    vector<Index>::iterator sI_last = _m_po->_m_lp_fromSI.end();
    while(sI_it != sI_last)
    {
        Index sI = *sI_it;
        vector<Index>::iterator jaI_it = _m_po->_m_lp_JAI.begin();
        vector<Index>::iterator jaI_last = _m_po->_m_lp_JAI.end();
        while(jaI_it != jaI_last)
        {
            Index jaI = *jaI_it;
            vector<Index>::iterator sucSI_it = _m_po->_m_lp_toSI.begin();
            vector<Index>::iterator sucSI_last = _m_po->_m_lp_toSI.end();
            while(sucSI_it != sucSI_last)
            {
                Index sucSI = *sucSI_it;
                for(Index joI=0; joI < nrJO; joI++) 
                {
                    _m_po->GetDecPOMDPDiscrete()->SetReward(sI, jaI, sucSI,joI, 
                        row[joI]);
                    if(DEBUG_PARSE)
                        cout << "Setting R("<<sI<<","<<jaI<<","<<sucSI<<
                            ","<<joI<<") = "<<row[joI]<<endl;
                }
                sucSI_it++;
            }
            jaI_it++;
        }
        sI_it++;
    }
}